

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall Tigre::String::String(String *this,double i)

{
  string local_38;
  double local_18;
  double i_local;
  String *this_local;
  
  local_18 = i;
  i_local = (double)this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::to_string(&local_38,local_18);
  std::__cxx11::string::operator=((string *)this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Tigre::String::String(double i){
    this->value = std::to_string(i);
}